

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS ref_recon_rsn_hess(REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *hessian)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  uint uVar1;
  REF_CLOUD *one_layer_00;
  REF_GLOB local_108;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT layer;
  REF_STATUS status;
  REF_DBL node_hessian [3];
  REF_DBL local_a8;
  REF_DBL n [3];
  REF_DBL local_88;
  REF_DBL s [3];
  REF_DBL local_68;
  REF_DBL r [3];
  REF_CLOUD ref_cloud;
  REF_INT im;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_CLOUD *one_layer;
  REF_DBL *hessian_local;
  REF_DBL *scalar_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[3];
  if (ref_node_00->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x670,
           "ref_recon_rsn_hess","malloc one_layer of REF_CLOUD negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    one_layer_00 = (REF_CLOUD *)malloc((long)ref_node_00->max << 3);
    if (one_layer_00 == (REF_CLOUD *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x670
             ,"ref_recon_rsn_hess","malloc one_layer of REF_CLOUD NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_node_00->max;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        one_layer_00[ref_private_macro_code_rss_1] = (REF_CLOUD)0x0;
      }
      for (ref_cloud._4_4_ = 0; ref_cloud._4_4_ < ref_node_00->max;
          ref_cloud._4_4_ = ref_cloud._4_4_ + 1) {
        if ((((-1 < ref_cloud._4_4_) && (ref_cloud._4_4_ < ref_node_00->max)) &&
            (-1 < ref_node_00->global[ref_cloud._4_4_])) &&
           (uVar1 = ref_cloud_create(one_layer_00 + ref_cloud._4_4_,4), uVar1 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x672,"ref_recon_rsn_hess",(ulong)uVar1,"cloud storage");
          return uVar1;
        }
      }
      ref_grid_local._4_4_ =
           ref_recon_local_immediate_cloud(one_layer_00,ref_node_00,ref_cell_00,scalar);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = ref_recon_ghost_cloud(one_layer_00,ref_node_00);
        if (ref_grid_local._4_4_ == 0) {
          for (ref_cloud._4_4_ = 0; ref_cloud._4_4_ < ref_node_00->max;
              ref_cloud._4_4_ = ref_cloud._4_4_ + 1) {
            if (((-1 < ref_cloud._4_4_) && (ref_cloud._4_4_ < ref_node_00->max)) &&
               ((-1 < ref_node_00->global[ref_cloud._4_4_] &&
                (ref_node_00->ref_mpi->id == ref_node_00->part[ref_cloud._4_4_])))) {
              uVar1 = ref_recon_rsn(ref_grid,ref_cloud._4_4_,&local_68,&local_88,&local_a8);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x67a,"ref_recon_rsn_hess",(ulong)uVar1,"rsn");
                return uVar1;
              }
              uVar1 = ref_cloud_deep_copy((REF_CLOUD *)(r + 2),one_layer_00[ref_cloud._4_4_]);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x67c,"ref_recon_rsn_hess",(ulong)uVar1,"create ref_cloud");
                return uVar1;
              }
              ref_malloc_init_i = 3;
              for (ref_private_macro_code_rss = 2;
                  ref_malloc_init_i != 0 && ref_private_macro_code_rss < 9;
                  ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                uVar1 = ref_recon_grow_cloud_one_layer((REF_CLOUD)r[2],one_layer_00,ref_node_00);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x680,"ref_recon_rsn_hess",(ulong)uVar1,"grow");
                  return uVar1;
                }
                if (((ref_cloud._4_4_ < 0) || (ref_node_00->max <= ref_cloud._4_4_)) ||
                   (ref_node_00->global[ref_cloud._4_4_] < 0)) {
                  local_108 = -1;
                }
                else {
                  local_108 = ref_node_00->global[ref_cloud._4_4_];
                }
                ref_malloc_init_i =
                     ref_recon_kexact_rs(local_108,(REF_CLOUD)r[2],&local_68,&local_88,
                                         (REF_DBL *)&layer);
                if ((ref_malloc_init_i == 4) && (4 < ref_private_macro_code_rss)) {
                  ref_node_location(ref_node_00,ref_cloud._4_4_);
                  printf(" caught %s, for %d layers to kexact cloud; retry\n","REF_DIV_ZERO",
                         (ulong)(uint)ref_private_macro_code_rss);
                }
                if ((ref_malloc_init_i == 8) && (4 < ref_private_macro_code_rss)) {
                  ref_node_location(ref_node_00,ref_cloud._4_4_);
                  printf(" caught %s, for %d layers to kexact cloud; retry\n","REF_ILL_CONDITIONED",
                         (ulong)(uint)ref_private_macro_code_rss);
                }
              }
              if (ref_malloc_init_i != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x68f,"ref_recon_rsn_hess",(ulong)(uint)ref_malloc_init_i,"kexact qr node");
                ref_node_location(ref_node_00,ref_cloud._4_4_);
                return ref_malloc_init_i;
              }
              for (ref_cloud._0_4_ = 0; (int)ref_cloud < 3; ref_cloud._0_4_ = (int)ref_cloud + 1) {
                hessian[(int)ref_cloud + ref_cloud._4_4_ * 3] =
                     *(REF_DBL *)(&layer + (long)(int)ref_cloud * 2);
              }
              uVar1 = ref_cloud_free((REF_CLOUD)r[2]);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x693,"ref_recon_rsn_hess",(ulong)uVar1,"free ref_cloud");
                return uVar1;
              }
            }
          }
          for (ref_cloud._4_4_ = 0; ref_cloud._4_4_ < ref_node_00->max;
              ref_cloud._4_4_ = ref_cloud._4_4_ + 1) {
            if (((-1 < ref_cloud._4_4_) && (ref_cloud._4_4_ < ref_node_00->max)) &&
               (-1 < ref_node_00->global[ref_cloud._4_4_])) {
              ref_cloud_free(one_layer_00[ref_cloud._4_4_]);
            }
          }
          if (one_layer_00 != (REF_CLOUD *)0x0) {
            free(one_layer_00);
          }
          ref_grid_local._4_4_ = ref_node_ghost_dbl(ref_node_00,hessian,3);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = ref_recon_abs_value_hessian2(ref_grid,hessian);
            if (ref_grid_local._4_4_ == 0) {
              ref_grid_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x69e,"ref_recon_rsn_hess",(ulong)ref_grid_local._4_4_,"abs(H)");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x69c,"ref_recon_rsn_hess",(ulong)ref_grid_local._4_4_,"update ghosts");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x676,"ref_recon_rsn_hess",(ulong)ref_grid_local._4_4_,"fill ghosts");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x675,"ref_recon_rsn_hess",(ulong)ref_grid_local._4_4_,"fill immediate cloud");
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_recon_rsn_hess(REF_GRID ref_grid, REF_DBL *scalar,
                                      REF_DBL *hessian) {
  REF_CLOUD *one_layer;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT node, im;
  REF_CLOUD ref_cloud;
  REF_DBL r[3], s[3], n[3];
  REF_DBL node_hessian[3];
  REF_STATUS status;
  REF_INT layer;

  ref_malloc_init(one_layer, ref_node_max(ref_node), REF_CLOUD, NULL);
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_cloud_create(&(one_layer[node]), 4), "cloud storage");
  }
  RSS(ref_recon_local_immediate_cloud(one_layer, ref_node, ref_cell, scalar),
      "fill immediate cloud");
  RSS(ref_recon_ghost_cloud(one_layer, ref_node), "fill ghosts");

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_recon_rsn(ref_grid, node, r, s, n), "rsn");
      /* use ref_cloud to get a unique list of halo(2) nodes */
      RSS(ref_cloud_deep_copy(&ref_cloud, one_layer[node]), "create ref_cloud");
      status = REF_INVALID;
      for (layer = 2; status != REF_SUCCESS && layer <= 8; layer++) {
        RSS(ref_recon_grow_cloud_one_layer(ref_cloud, one_layer, ref_node),
            "grow");

        status = ref_recon_kexact_rs(ref_node_global(ref_node, node), ref_cloud,
                                     r, s, node_hessian);
        if (REF_DIV_ZERO == status && layer > 4) {
          ref_node_location(ref_node, node);
          printf(" caught %s, for %d layers to kexact cloud; retry\n",
                 "REF_DIV_ZERO", layer);
        }
        if (REF_ILL_CONDITIONED == status && layer > 4) {
          ref_node_location(ref_node, node);
          printf(" caught %s, for %d layers to kexact cloud; retry\n",
                 "REF_ILL_CONDITIONED", layer);
        }
      }
      RSB(status, "kexact qr node", { ref_node_location(ref_node, node); });
      for (im = 0; im < 3; im++) {
        hessian[im + 3 * node] = node_hessian[im];
      }
      RSS(ref_cloud_free(ref_cloud), "free ref_cloud");
    }
  }

  each_ref_node_valid_node(ref_node, node) {
    ref_cloud_free(one_layer[node]); /* no-op for null */
  }
  ref_free(one_layer);

  RSS(ref_node_ghost_dbl(ref_node, hessian, 3), "update ghosts");

  RSS(ref_recon_abs_value_hessian2(ref_grid, hessian), "abs(H)");

  return REF_SUCCESS;
}